

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

string * glcts::anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>(void)

{
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  string *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *in_RDI;
  long *local_30;
  undefined8 local_28;
  long local_20;
  undefined4 local_18;
  undefined1 local_14;
  
  local_20 = 0x6e6f697372657623;
  local_18 = 0x30303420;
  local_28 = 0xc;
  local_14 = 0;
  local_30 = &local_20;
  psVar3 = (string *)std::__cxx11::string::append((char *)&local_30);
  *in_RDI = (long)(in_RDI + 2);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  paVar4 = &psVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar4) {
    lVar2 = *(long *)((long)&psVar3->field_2 + 8);
    in_RDI[2] = paVar4->_M_allocated_capacity;
    in_RDI[3] = lVar2;
  }
  else {
    *in_RDI = (long)pcVar1;
    in_RDI[2] = paVar4->_M_allocated_capacity;
  }
  in_RDI[1] = psVar3->_M_string_length;
  (psVar3->_M_dataplus)._M_p = (pointer)paVar4;
  psVar3->_M_string_length = 0;
  (psVar3->field_2)._M_local_buf[0] = '\0';
  if (local_30 != &local_20) {
    operator_delete(local_30,local_20 + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string vshSimple()
{
	return api::glslVer() + NL "in vec4 i_vertex;" NL "void main()" NL "{" NL "    gl_Position = i_vertex;" NL "}";
}